

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O0

Matrix33d * gmath::createSkewSymmetric(Vector3d *a)

{
  double *pdVar1;
  SVector<double,_3> *in_RSI;
  SMatrix<double,_3,_3> *in_RDI;
  double dVar2;
  Matrix33d *S;
  
  SMatrix<double,_3,_3>::SMatrix(in_RDI);
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,0,0);
  *pdVar1 = 0.0;
  dVar2 = SVector<double,_3>::operator[](in_RSI,2);
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,0,1);
  *pdVar1 = -dVar2;
  dVar2 = SVector<double,_3>::operator[](in_RSI,1);
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,0,2);
  *pdVar1 = dVar2;
  dVar2 = SVector<double,_3>::operator[](in_RSI,2);
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,1,0);
  *pdVar1 = dVar2;
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,1,1);
  *pdVar1 = 0.0;
  dVar2 = SVector<double,_3>::operator[](in_RSI,0);
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,1,2);
  *pdVar1 = -dVar2;
  dVar2 = SVector<double,_3>::operator[](in_RSI,1);
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,2,0);
  *pdVar1 = -dVar2;
  dVar2 = SVector<double,_3>::operator[](in_RSI,0);
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,2,1);
  *pdVar1 = dVar2;
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,2,2);
  *pdVar1 = 0.0;
  return in_RDI;
}

Assistant:

inline Matrix33d createSkewSymmetric(const Vector3d &a)
{
  Matrix33d S;

  S(0, 0)=0;     S(0, 1)=-a[2]; S(0, 2)=a[1];
  S(1, 0)=a[2];  S(1, 1)=0;     S(1, 2)=-a[0];
  S(2, 0)=-a[1]; S(2, 1)=a[0];  S(2, 2)=0;

  return S;
}